

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertyMap.cpp
# Opt level: O2

void __thiscall
OpenMD::PropertyMap::addProperty(PropertyMap *this,shared_ptr<OpenMD::GenericData> *genData)

{
  iterator iVar1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>
  local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string
            ((string *)&local_70,
             (string *)
             &((genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
              )->id_);
  iVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>_>_>
          ::find(&(this->propMap_)._M_t,&local_70.first);
  std::__cxx11::string::~string((string *)&local_70);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->propMap_)._M_t._M_impl.super__Rb_tree_header) {
    std::__cxx11::string::string
              ((string *)&local_40,
               (string *)
               &((genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->id_);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>
    ::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_&,_true>
              (&local_70,&local_40,genData);
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,std::shared_ptr<OpenMD::GenericData>>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::shared_ptr<OpenMD::GenericData>>>>
                *)&this->propMap_,&local_70);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<OpenMD::GenericData>_>
    ::~pair(&local_70);
    std::__cxx11::string::~string((string *)&local_40);
  }
  else {
    std::__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2> *)(iVar1._M_node + 2),
               &genData->super___shared_ptr<OpenMD::GenericData,_(__gnu_cxx::_Lock_policy)2>);
  }
  return;
}

Assistant:

void PropertyMap::addProperty(std::shared_ptr<GenericData> genData) {
    std::map<std::string, std::shared_ptr<GenericData>>::iterator iter;

    iter = propMap_.find(genData->getID());

    if (iter == propMap_.end()) {
      propMap_.insert(std::make_pair(genData->getID(), genData));
    } else {
      iter->second = genData;
    }
  }